

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec,xmlChar *value,void *data)

{
  int iVar1;
  xmlRegInputTokenPtr pxVar2;
  xmlChar *pxVar3;
  int newSize;
  xmlRegInputTokenPtr tmp;
  void *data_local;
  xmlChar *value_local;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec->inputStackMax <= exec->inputStackNr + 1) {
    iVar1 = xmlGrowCapacity(exec->inputStackMax,0x10,4,1000000000);
    if (iVar1 < 0) {
      exec->status = -5;
      return;
    }
    pxVar2 = (xmlRegInputTokenPtr)(*xmlRealloc)(exec->inputStack,(long)iVar1 << 4);
    if (pxVar2 == (xmlRegInputTokenPtr)0x0) {
      exec->status = -5;
      return;
    }
    exec->inputStack = pxVar2;
    exec->inputStackMax = iVar1;
  }
  if (value == (xmlChar *)0x0) {
    exec->inputStack[exec->inputStackNr].value = (xmlChar *)0x0;
  }
  else {
    pxVar3 = xmlStrdup(value);
    exec->inputStack[exec->inputStackNr].value = pxVar3;
    if (exec->inputStack[exec->inputStackNr].value == (xmlChar *)0x0) {
      exec->status = -5;
      return;
    }
  }
  exec->inputStack[exec->inputStackNr].data = data;
  exec->inputStackNr = exec->inputStackNr + 1;
  exec->inputStack[exec->inputStackNr].value = (xmlChar *)0x0;
  exec->inputStack[exec->inputStackNr].data = (void *)0x0;
  return;
}

Assistant:

static void
xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                    void *data) {
    if (exec->inputStackNr + 1 >= exec->inputStackMax) {
	xmlRegInputTokenPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(exec->inputStackMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (newSize < 2)
            newSize = 2;
#endif
	tmp = xmlRealloc(exec->inputStack, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->inputStack = tmp;
	exec->inputStackMax = newSize;
    }
    if (value == NULL) {
        exec->inputStack[exec->inputStackNr].value = NULL;
    } else {
        exec->inputStack[exec->inputStackNr].value = xmlStrdup(value);
        if (exec->inputStack[exec->inputStackNr].value == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
            return;
        }
    }
    exec->inputStack[exec->inputStackNr].data = data;
    exec->inputStackNr++;
    exec->inputStack[exec->inputStackNr].value = NULL;
    exec->inputStack[exec->inputStackNr].data = NULL;
}